

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O3

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceLayoutAboutToBeChanged
          (QSortFilterProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  QList<QPersistentModelIndex> *this_00;
  QObject *this_01;
  Data *pDVar1;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar2;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar3;
  bool bVar4;
  long lVar5;
  QModelIndex *this_02;
  QPersistentModelIndex *this_03;
  long in_FS_OFFSET;
  Data *local_78;
  pair<QModelIndex,_QPersistentModelIndex> *ppStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  Data *local_58;
  pair<QModelIndex,_QPersistentModelIndex> *ppStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  QList<std::pair<QModelIndex,_QPersistentModelIndex>_>::clear(&this->saved_persistent_indexes);
  this_00 = &this->saved_layoutChange_parents;
  QList<QPersistentModelIndex>::clear(this_00);
  lVar5 = (sourceParents->d).size;
  if (lVar5 != 0) {
    this_03 = (sourceParents->d).ptr;
    lVar5 = lVar5 << 3;
    do {
      bVar4 = QPersistentModelIndex::isValid(this_03);
      if (bVar4) {
        local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        ppStack_50 = (pair<QModelIndex,_QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::operator_cast_to_QModelIndex(this_03);
        (*this_01->_vptr_QObject[0x33])((QModelIndex *)&local_58,this_01,(QModelIndex *)&local_78);
        if (((-1 < (int)local_58) && (-1 < (long)local_58)) &&
           (local_48.ptr != (QAbstractItemModel *)0x0)) {
          QPersistentModelIndex::QPersistentModelIndex
                    ((QPersistentModelIndex *)&local_78,(QModelIndex *)&local_58);
          QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                    ((QMovableArrayOps<QPersistentModelIndex> *)this_00,
                     (this->saved_layoutChange_parents).d.size,(QPersistentModelIndex *)&local_78);
          QList<QPersistentModelIndex>::end(this_00);
          this_02 = (QModelIndex *)&local_78;
          goto LAB_00477cab;
        }
      }
      else {
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_58);
        QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                  ((QMovableArrayOps<QPersistentModelIndex> *)this_00,
                   (this->saved_layoutChange_parents).d.size,(QPersistentModelIndex *)&local_58);
        QList<QPersistentModelIndex>::end(this_00);
        this_02 = (QModelIndex *)&local_58;
LAB_00477cab:
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)this_02);
      }
      this_03 = this_03 + 1;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
    if (((sourceParents->d).size != 0) && ((this->saved_layoutChange_parents).d.size == 0))
    goto LAB_00477d53;
  }
  QAbstractItemModel::layoutAboutToBeChanged
            ((QAbstractItemModel *)this_01,this_00,NoLayoutChangeHint);
  if ((this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.persistent.indexes.
      m_size != 0) {
    store_persistent_indexes((QModelIndexPairList *)&local_78,this);
    tVar3.ptr = local_68.ptr;
    ppVar2 = ppStack_70;
    pDVar1 = local_78;
    local_68.ptr = (QAbstractItemModel *)0x0;
    local_78 = (Data *)0x0;
    ppStack_70 = (pair<QModelIndex,_QPersistentModelIndex> *)0x0;
    local_58 = (this->saved_persistent_indexes).d.d;
    ppStack_50 = (this->saved_persistent_indexes).d.ptr;
    (this->saved_persistent_indexes).d.d = pDVar1;
    (this->saved_persistent_indexes).d.ptr = ppVar2;
    local_48.ptr = (QAbstractItemModel *)(this->saved_persistent_indexes).d.size;
    (this->saved_persistent_indexes).d.size = (qsizetype)tVar3.ptr;
    QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::~QArrayDataPointer
              ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)&local_58);
    QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::~QArrayDataPointer
              ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)&local_78);
  }
LAB_00477d53:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceLayoutAboutToBeChanged(const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QSortFilterProxyModel);
    Q_UNUSED(hint); // We can't forward Hint because we might filter additional rows or columns
    saved_persistent_indexes.clear();

    saved_layoutChange_parents.clear();
    for (const QPersistentModelIndex &parent : sourceParents) {
        if (!parent.isValid()) {
            saved_layoutChange_parents << QPersistentModelIndex();
            continue;
        }
        const QModelIndex mappedParent = q->mapFromSource(parent);
        // Might be filtered out.
        if (mappedParent.isValid())
            saved_layoutChange_parents << mappedParent;
    }

    // All parents filtered out.
    if (!sourceParents.isEmpty() && saved_layoutChange_parents.isEmpty())
        return;

    emit q->layoutAboutToBeChanged(saved_layoutChange_parents);
    if (persistent.indexes.isEmpty())
        return;

    saved_persistent_indexes = store_persistent_indexes();
}